

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::FunctionOptimizer::create(FunctionOptimizer *this)

{
  byte bVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  long in_RSI;
  
  p_Var2 = *(_func_int **)(in_RSI + 0x140);
  bVar1 = *(byte *)(in_RSI + 0x148);
  pp_Var4 = (_func_int **)operator_new(0x150);
  pp_Var4[1] = (_func_int *)0x0;
  pp_Var4[2] = (_func_int *)(pp_Var4 + 4);
  pp_Var4[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var4 + 4) = 0;
  *(undefined1 *)(pp_Var4 + 10) = 0;
  pp_Var4[0xb] = (_func_int *)0x0;
  pp_Var4[0xc] = (_func_int *)0x0;
  pp_Var4[0x21] = (_func_int *)0x0;
  pp_Var4[0x22] = (_func_int *)0x0;
  pp_Var4[0x23] = (_func_int *)0x0;
  pp_Var4[0x24] = (_func_int *)0x0;
  pp_Var4[0x25] = (_func_int *)0x0;
  *pp_Var4 = (_func_int *)&PTR__WalkerPass_01071d60;
  p_Var3 = *(_func_int **)(in_RSI + 0x138);
  pp_Var4[0x26] = *(_func_int **)(in_RSI + 0x130);
  pp_Var4[0x27] = p_Var3;
  pp_Var4[0x28] = p_Var2;
  *(byte *)(pp_Var4 + 0x29) = bVar1 & 1;
  *(undefined1 *)((long)pp_Var4 + 0x149) = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
  ).super_Pass._vptr_Pass = pp_Var4;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionOptimizer>(
      propagatedInfos, subTypes, rawNewInfos, refTest);
  }